

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

int BuiltinNameToClass(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  bool bVar1;
  PClass *ti;
  PClass *val;
  FName local_1c;
  
  if (numparam != 2) {
    __assert_fail("numparam == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x254a,
                  "int BuiltinNameToClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numret != 1) {
    __assert_fail("numret == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x254b,
                  "int BuiltinNameToClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if ((param->field_0).field_3.Type != '\0') {
    __assert_fail("param[0].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x254c,
                  "int BuiltinNameToClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\x03') {
    __assert_fail("param[1].Type == REGT_POINTER",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x254d,
                  "int BuiltinNameToClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (ret->RegType != '\x03') {
    __assert_fail("ret->RegType == REGT_POINTER",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x254e,
                  "int BuiltinNameToClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if ((param->field_0).i == 0) {
    val = (PClass *)0x0;
  }
  else {
    local_1c.Index = (param->field_0).i;
    ti = PClass::FindClass(&local_1c);
    bVar1 = PClass::IsAncestorOf((PClass *)param[1].field_0.field_1.a,ti);
    val = (PClass *)0x0;
    if (bVar1) {
      val = ti;
    }
  }
  VMReturn::SetPointer(ret,val,1);
  return 1;
}

Assistant:

int BuiltinNameToClass(VMValue *param, TArray<VMValue> &defaultparam, int numparam, VMReturn *ret, int numret)
{
	assert(numparam == 2);
	assert(numret == 1);
	assert(param[0].Type == REGT_INT);
	assert(param[1].Type == REGT_POINTER);
	assert(ret->RegType == REGT_POINTER);

	FName clsname = ENamedName(param[0].i);
	if (clsname != NAME_None)
	{
		const PClass *cls = PClass::FindClass(clsname);
		const PClass *desttype = reinterpret_cast<PClass *>(param[1].a);

		if (!cls->IsDescendantOf(desttype))
		{
			// Let the caller check this. Making this an error with a message is only taking away options from the user.
			cls = nullptr;
		}
		ret->SetPointer(const_cast<PClass *>(cls), ATAG_OBJECT);
	}
	else ret->SetPointer(nullptr, ATAG_OBJECT);
	return 1;
}